

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO2Quad<double> *this,
          MatrixXd *refcoords)

{
  long lVar1;
  long lVar2;
  Index IVar3;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar4;
  CoeffReturnType piVar5;
  variable_if_dynamic<long,__1> vVar6;
  long lVar7;
  PointerType pdVar8;
  double *pdVar9;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *pCVar10;
  undefined8 *puVar11;
  int i;
  long row;
  double *pdVar12;
  byte bVar13;
  Array<double,__1,__1,_0,__1,__1> segment_x1_eval;
  Array<double,__1,__1,_0,__1,__1> segment_x0_eval;
  stringstream ss;
  assign_op<double,_double> local_311;
  Matrix<double,__1,__1,_0,__1,__1> *local_310;
  undefined1 local_308 [56];
  undefined1 local_2d0 [56];
  Array<double,__1,__1,_0,__1,__1> local_298;
  Array<double,__1,__1,_0,__1,__1> local_280;
  undefined1 local_268 [120];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_1f0;
  undefined1 local_1b8 [24];
  XprTypeNested local_1a0;
  double *local_180;
  XprTypeNested local_168;
  
  bVar13 = 0;
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 2) {
    IVar3 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,9,
               (ulong)(uint)IVar3);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               refcoords,0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_308,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)local_1b8);
    FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_268,
               (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)local_308);
    local_2d0._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_268;
    Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_280,
               (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_2d0);
    free((void *)local_268._0_8_);
    free((void *)local_308._0_8_);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               refcoords,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_308,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)local_1b8);
    FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_268,
               (FeLagrangeO2Segment<double> *)&krsf_segment_,(MatrixXd *)local_308);
    local_2d0._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_268;
    Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)&local_298,
               (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_2d0);
    free((void *)local_268._0_8_);
    free((void *)local_308._0_8_);
    row = 0;
    local_310 = __return_storage_ptr__;
    do {
      pMVar4 = local_310;
      piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                          &ksegment_to_quad_mapping_,row,0);
      Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_308,
                 &local_280,(long)*piVar5);
      piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                          &ksegment_to_quad_mapping_,row,1);
      Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2d0,
                 &local_298,(long)*piVar5);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                       *)local_268,
                      (Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_308,
                      (Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2d0,
                      (scalar_product_op<double,_double> *)&local_1f0);
      pCVar10 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                 *)local_268;
      puVar11 = (undefined8 *)local_1b8;
      for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar11 = (pCVar10->m_lhs).
                   super_BlockImpl<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                   .m_data;
        pCVar10 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)((long)pCVar10 + (ulong)bVar13 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      }
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                (&local_1f0,pMVar4,row);
      pdVar9 = local_180;
      pdVar12 = (double *)local_1b8._0_8_;
      lVar7 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               &local_1a0->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>)->
              m_storage).m_rows;
      lVar1 = (local_168->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const,Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>const>const>,double,double>
                (&local_1f0,
                 (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                  *)local_1b8,&local_311);
      pMVar4 = local_310;
      if (0 < local_1f0.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar2 = ((local_1f0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        vVar6.m_value =
             local_1f0.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value;
        pdVar8 = local_1f0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                 .m_data;
        do {
          *pdVar8 = *pdVar12 * *pdVar9;
          pdVar9 = pdVar9 + lVar1;
          pdVar12 = pdVar12 + lVar7;
          pdVar8 = pdVar8 + lVar2;
          vVar6.m_value = vVar6.m_value + -1;
        } while (vVar6.m_value != 0);
      }
      row = row + 1;
    } while (row != 9);
    free(local_298.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_280.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    return pMVar4;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"Reference coordinates must be 2-vectors",0x27);
  pdVar9 = (double *)(local_268 + 0x10);
  local_268._0_8_ = pdVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"refcoords.rows() == 2","");
  pdVar12 = (double *)(local_308 + 0x10);
  local_308._0_8_ = pdVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_268,(string *)local_308,0x30e,(string *)local_2d0);
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if ((double *)local_308._0_8_ != pdVar12) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  if ((double *)local_268._0_8_ != pdVar9) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  local_268._0_8_ = pdVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"false","");
  local_308._0_8_ = pdVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  base::AssertionFailed((string *)local_268,(string *)local_308,0x30e,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string((string *)local_268);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    // Number of evaluation points
    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(9, n_pts);

    // evaluate "segment" shape functions (b^j and b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(0))).array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(1))).array();

    // Evaluate basis functions using the tensor product structure
    for (int i = 0; i < 9; ++i) {
      result.row(i) = (segment_x0_eval.row(ksegment_to_quad_mapping_(i, 0)) *
                       segment_x1_eval.row(ksegment_to_quad_mapping_(i, 1)))
                          .matrix();
    }
    return result;
  }